

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition.hxx
# Opt level: O0

void __thiscall
andres::Partition<unsigned_long>::
elementLabeling<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Partition<unsigned_long> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          out)

{
  mapped_type mVar1;
  Partition<unsigned_long> *pPVar2;
  mapped_type *pmVar3;
  reference puVar4;
  Index j;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  rl;
  Index in_stack_ffffffffffffff78;
  Partition<unsigned_long> *this_00;
  Partition<unsigned_long> *__k;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffb0;
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *in_stack_ffffffffffffffd8;
  Partition<unsigned_long> *in_stack_ffffffffffffffe0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8;
  
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
         *)0x163e43);
  representativeLabeling(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  this_00 = (Partition<unsigned_long> *)0x0;
  while( true ) {
    __k = this_00;
    pPVar2 = (Partition<unsigned_long> *)numberOfElements((Partition<unsigned_long> *)0x163e71);
    if (pPVar2 <= this_00) break;
    in_stack_ffffffffffffff78 = find(this_00,in_stack_ffffffffffffff78);
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](in_stack_ffffffffffffffb0,(key_type *)__k);
    mVar1 = *pmVar3;
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*(&local_8);
    *puVar4 = mVar1;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_8);
    this_00 = (Partition<unsigned_long> *)
              ((long)&(__k->parents_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start + 1);
  }
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~map((map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          *)0x163f25);
  return;
}

Assistant:

inline void 
Partition<T>::elementLabeling(
    Iterator out
) const {
    std::map<Index, Index> rl;
    representativeLabeling(rl);
    for(Index j = 0; j < numberOfElements(); ++j) {
        *out = rl[find(j)];
        ++out;
    }
}